

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O1

int sam_hdr_update_hashes(SAM_hdr *sh,int type,SAM_hdr_type *h_type)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  kh_cstr_t pcVar4;
  kh_m_s2i_t *pkVar5;
  khint32_t *pkVar6;
  char cVar7;
  uint32_t uVar8;
  khint_t kVar9;
  uint uVar10;
  int iVar11;
  SAM_SQ *pSVar12;
  char *pcVar13;
  SAM_RG *pSVar14;
  size_t sVar15;
  SAM_PG *pSVar16;
  ulong uVar17;
  int *piVar18;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  SAM_hdr_tag *pSVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  int r_2;
  int r_1;
  int r;
  int local_3c;
  int local_38;
  int local_34;
  
  iVar22 = type >> 8;
  if ((type & 0xffU) == 0x51 && iVar22 == 0x53) {
    iVar23 = sh->nref;
    lVar26 = (long)iVar23;
    pSVar12 = (SAM_SQ *)realloc(sh->ref,lVar26 * 0x20 + 0x20);
    sh->ref = pSVar12;
    if (pSVar12 == (SAM_SQ *)0x0) {
      return -1;
    }
    pSVar24 = h_type->tag;
    pSVar12[lVar26].name = (char *)0x0;
    pSVar12[lVar26].len = 0;
    pSVar12[lVar26].ty = h_type;
    pSVar12[lVar26].tag = pSVar24;
    for (; pSVar24 != (SAM_hdr_tag *)0x0; pSVar24 = pSVar24->next) {
      pcVar3 = pSVar24->str;
      if (*pcVar3 == 'L') {
        if (pcVar3[1] == 'N') {
          uVar8 = atoi(pcVar3 + 3);
          sh->ref[lVar26].len = uVar8;
        }
      }
      else if ((*pcVar3 == 'S') && (pcVar3[1] == 'N')) {
        iVar11 = pSVar24->len;
        pcVar13 = (char *)malloc((long)iVar11);
        pSVar12 = sh->ref;
        pSVar12[lVar26].name = pcVar13;
        if (pcVar13 == (char *)0x0) goto LAB_00139443;
        strncpy(pcVar13,pcVar3 + 3,(long)iVar11 - 3);
        pSVar12[lVar26].name[(long)pSVar24->len + -3] = '\0';
      }
    }
    pcVar4 = sh->ref[lVar26].name;
    if (pcVar4 == (kh_cstr_t)0x0) {
LAB_00138f80:
      sh->nref = sh->nref + 1;
      goto LAB_00138f8d;
    }
    kVar9 = kh_put_m_s2i(sh->ref_hash,pcVar4,&local_34);
    if (local_34 != -1) {
      sh->ref_hash->vals[kVar9] = iVar23;
      goto LAB_00138f80;
    }
LAB_00139443:
    iVar23 = -1;
  }
  else {
LAB_00138f8d:
    if (iVar22 == 0x52 && (type & 0xffU) == 0x47) {
      iVar23 = sh->nrg;
      lVar26 = (long)iVar23;
      pSVar14 = (SAM_RG *)realloc(sh->rg,lVar26 * 0x20 + 0x20);
      sh->rg = pSVar14;
      if (pSVar14 == (SAM_RG *)0x0) {
        return -1;
      }
      pSVar24 = h_type->tag;
      pSVar14[lVar26].name = (char *)0x0;
      pSVar14[lVar26].name_len = 0;
      pSVar14[lVar26].ty = h_type;
      pSVar14[lVar26].tag = pSVar24;
      pSVar14[lVar26].id = iVar23;
      for (; pSVar24 != (SAM_hdr_tag *)0x0; pSVar24 = pSVar24->next) {
        pcVar3 = pSVar24->str;
        if ((*pcVar3 == 'I') && (pcVar3[1] == 'D')) {
          iVar11 = pSVar24->len;
          pcVar13 = (char *)malloc((long)iVar11);
          pSVar14 = sh->rg;
          pSVar14[lVar26].name = pcVar13;
          if (pcVar13 == (char *)0x0) goto LAB_00139443;
          strncpy(pcVar13,pcVar3 + 3,(long)iVar11 - 3);
          pSVar14[lVar26].name[(long)pSVar24->len + -3] = '\0';
          pSVar14 = sh->rg;
          sVar15 = strlen(pSVar14[lVar26].name);
          pSVar14[lVar26].name_len = (int)sVar15;
        }
      }
      pcVar4 = sh->rg[lVar26].name;
      if (pcVar4 != (kh_cstr_t)0x0) {
        kVar9 = kh_put_m_s2i(sh->rg_hash,pcVar4,&local_38);
        if (local_38 == -1) goto LAB_00139443;
        sh->rg_hash->vals[kVar9] = iVar23;
      }
      sh->nrg = sh->nrg + 1;
    }
    iVar23 = 0;
    if (iVar22 == 0x50 && (type & 0xffU) == 0x47) {
      iVar22 = sh->npg;
      lVar26 = (long)iVar22;
      pSVar16 = (SAM_PG *)realloc(sh->pg,lVar26 * 0x28 + 0x28);
      sh->pg = pSVar16;
      iVar23 = -1;
      if (pSVar16 != (SAM_PG *)0x0) {
        pSVar24 = h_type->tag;
        pSVar16[lVar26].name = (char *)0x0;
        pSVar16[lVar26].name_len = 0;
        pSVar16[lVar26].ty = h_type;
        pSVar16[lVar26].tag = pSVar24;
        pSVar16[lVar26].id = iVar22;
        pSVar16[lVar26].prev_id = -1;
        for (; pSVar24 != (SAM_hdr_tag *)0x0; pSVar24 = pSVar24->next) {
          pcVar3 = pSVar24->str;
          if (*pcVar3 == 'P') {
            if (pcVar3[1] == 'P') {
              cVar1 = pcVar3[pSVar24->len];
              pcVar3[pSVar24->len] = '\0';
              pkVar5 = sh->pg_hash;
              pcVar3 = pSVar24->str;
              uVar20 = pkVar5->n_buckets;
              if (uVar20 == 0) {
                uVar20 = 0;
              }
              else {
                cVar7 = pcVar3[3];
                uVar21 = (uint)cVar7;
                if (cVar7 == '\0') {
                  uVar21 = 0;
                }
                else {
                  cVar7 = pcVar3[4];
                  if (cVar7 != '\0') {
                    pcVar13 = pcVar3 + 5;
                    do {
                      uVar21 = (int)cVar7 + uVar21 * 0x1f;
                      cVar7 = *pcVar13;
                      pcVar13 = pcVar13 + 1;
                    } while (cVar7 != '\0');
                  }
                }
                uVar21 = uVar21 & uVar20 - 1;
                pkVar6 = pkVar5->flags;
                iVar23 = 1;
                uVar25 = uVar21;
                do {
                  uVar2 = pkVar6[uVar25 >> 4];
                  bVar19 = (char)uVar25 * '\x02' & 0x1e;
                  uVar10 = uVar2 >> bVar19;
                  if (((uVar10 & 2) != 0) ||
                     (((uVar10 & 1) == 0 &&
                      (iVar11 = strcmp(pkVar5->keys[uVar25],pcVar3 + 3), iVar11 == 0)))) {
                    if ((uVar2 >> bVar19 & 3) == 0) {
                      uVar20 = uVar25;
                    }
                    break;
                  }
                  uVar25 = uVar25 + iVar23 & uVar20 - 1;
                  iVar23 = iVar23 + 1;
                } while (uVar25 != uVar21);
              }
              pcVar3[pSVar24->len] = cVar1;
              if (uVar20 == sh->pg_hash->n_buckets) {
                sh->pg[lVar26].prev_id = -1;
              }
              else {
                iVar23 = sh->pg_hash->vals[uVar20];
                sh->pg[lVar26].prev_id = sh->pg[iVar23].id;
                iVar11 = sh->npg_end;
                if (((long)iVar11 < 1) || (sh->pg_end[(long)iVar11 + -1] != iVar23)) {
                  uVar17 = (ulong)(uint)sh->npg_end;
                  if (0 < sh->npg_end) {
                    iVar11 = -1;
                    lVar27 = 0;
                    do {
                      piVar18 = sh->pg_end;
                      if (piVar18[lVar27] == iVar23) {
                        memmove(piVar18 + lVar27,piVar18 + lVar27 + 1,
                                (long)((int)uVar17 + iVar11) << 2);
                        sh->npg_end = sh->npg_end + -1;
                      }
                      lVar27 = lVar27 + 1;
                      uVar17 = (ulong)sh->npg_end;
                      iVar11 = iVar11 + -1;
                    } while (lVar27 < (long)uVar17);
                  }
                }
                else {
                  sh->npg_end = iVar11 + -1;
                }
              }
            }
          }
          else if ((*pcVar3 == 'I') && (pcVar3[1] == 'D')) {
            iVar23 = pSVar24->len;
            pcVar13 = (char *)malloc((long)iVar23);
            pSVar16 = sh->pg;
            pSVar16[lVar26].name = pcVar13;
            if (pcVar13 == (char *)0x0) goto LAB_00139443;
            strncpy(pcVar13,pcVar3 + 3,(long)iVar23 - 3);
            pSVar16[lVar26].name[(long)pSVar24->len + -3] = '\0';
            pSVar16 = sh->pg;
            sVar15 = strlen(pSVar16[lVar26].name);
            pSVar16[lVar26].name_len = (int)sVar15;
          }
        }
        pcVar4 = sh->pg[lVar26].name;
        if (pcVar4 != (kh_cstr_t)0x0) {
          kVar9 = kh_put_m_s2i(sh->pg_hash,pcVar4,&local_3c);
          if (local_3c == -1) {
            return -1;
          }
          sh->pg_hash->vals[kVar9] = iVar22;
        }
        iVar23 = sh->npg_end_alloc;
        if (iVar23 <= sh->npg_end) {
          iVar11 = 4;
          if (iVar23 != 0) {
            iVar11 = iVar23 * 2;
          }
          sh->npg_end_alloc = iVar11;
          piVar18 = (int *)realloc(sh->pg_end,(long)iVar11 << 2);
          sh->pg_end = piVar18;
          if (piVar18 == (int *)0x0) {
            return -1;
          }
        }
        iVar23 = sh->npg_end;
        sh->npg_end = iVar23 + 1;
        sh->pg_end[iVar23] = iVar22;
        sh->npg = sh->npg + 1;
        iVar23 = 0;
      }
    }
  }
  return iVar23;
}

Assistant:

static int sam_hdr_update_hashes(SAM_hdr *sh,
				 int type,
				 SAM_hdr_type *h_type) {
    /* Add to reference hash? */
    if ((type>>8) == 'S' && (type&0xff) == 'Q') {
	SAM_hdr_tag *tag;
	int nref = sh->nref;

	sh->ref = realloc(sh->ref, (sh->nref+1)*sizeof(*sh->ref));
	if (!sh->ref)
	    return -1;

	tag = h_type->tag;
	sh->ref[nref].name = NULL;
	sh->ref[nref].len  = 0;
	sh->ref[nref].ty = h_type;
	sh->ref[nref].tag  = tag;

	while (tag) {
	    if (tag->str[0] == 'S' && tag->str[1] == 'N') {
		if (!(sh->ref[nref].name = malloc(tag->len)))
		    return -1;
		strncpy(sh->ref[nref].name, tag->str+3, tag->len-3);
		sh->ref[nref].name[tag->len-3] = 0;
	    } else if (tag->str[0] == 'L' && tag->str[1] == 'N') {
		sh->ref[nref].len = atoi(tag->str+3);
	    }
	    tag = tag->next;
	}

	if (sh->ref[nref].name) {
	    khint_t k;
	    int r;
	    k = kh_put(m_s2i, sh->ref_hash, sh->ref[nref].name, &r);
	    if (-1 == r) return -1;
	    kh_val(sh->ref_hash, k) = nref;
	}

	sh->nref++;
    }

    /* Add to read-group hash? */
    if ((type>>8) == 'R' && (type&0xff) == 'G') {
	SAM_hdr_tag *tag;
	int nrg = sh->nrg;

	sh->rg = realloc(sh->rg, (sh->nrg+1)*sizeof(*sh->rg));
	if (!sh->rg)
	    return -1;

	tag = h_type->tag;
	sh->rg[nrg].name = NULL;
	sh->rg[nrg].name_len = 0;
	sh->rg[nrg].ty   = h_type;
	sh->rg[nrg].tag  = tag;
	sh->rg[nrg].id   = nrg;

	while (tag) {
	    if (tag->str[0] == 'I' && tag->str[1] == 'D') {
		if (!(sh->rg[nrg].name = malloc(tag->len)))
		    return -1;
		strncpy(sh->rg[nrg].name, tag->str+3, tag->len-3);
		sh->rg[nrg].name[tag->len-3] = 0;
		sh->rg[nrg].name_len = strlen(sh->rg[nrg].name);
	    }
	    tag = tag->next;
	}

	if (sh->rg[nrg].name) {
	    khint_t k;
	    int r;
	    k = kh_put(m_s2i, sh->rg_hash, sh->rg[nrg].name, &r);
	    if (-1 == r) return -1;
	    kh_val(sh->rg_hash, k) = nrg;
	}

	sh->nrg++;
    }

    /* Add to program hash? */
    if ((type>>8) == 'P' && (type&0xff) == 'G') {
	SAM_hdr_tag *tag;
	int npg = sh->npg;

	sh->pg = realloc(sh->pg, (sh->npg+1)*sizeof(*sh->pg));
	if (!sh->pg)
	    return -1;

	tag = h_type->tag;
	sh->pg[npg].name = NULL;
	sh->pg[npg].name_len = 0;
	sh->pg[npg].ty  = h_type;
	sh->pg[npg].tag  = tag;
	sh->pg[npg].id   = npg;
	sh->pg[npg].prev_id = -1;

	while (tag) {
	    if (tag->str[0] == 'I' && tag->str[1] == 'D') {
		if (!(sh->pg[npg].name = malloc(tag->len)))
		    return -1;
		strncpy(sh->pg[npg].name, tag->str+3, tag->len-3);
		sh->pg[npg].name[tag->len-3] = 0;
		sh->pg[npg].name_len = strlen(sh->pg[npg].name);
	    } else if (tag->str[0] == 'P' && tag->str[1] == 'P') {
		// Resolve later if needed
		khint_t k;
		char tmp = tag->str[tag->len]; tag->str[tag->len] = 0;
		k = kh_get(m_s2i, sh->pg_hash, tag->str+3);
		tag->str[tag->len] = tmp;

		if (k != kh_end(sh->pg_hash)) {
		    int p_id = kh_val(sh->pg_hash, k);
		    sh->pg[npg].prev_id = sh->pg[p_id].id;

		    /* Unmark previous entry as a PG termination */
		    if (sh->npg_end > 0 &&
			sh->pg_end[sh->npg_end-1] == p_id) {
			sh->npg_end--;
		    } else {
			int i;
			for (i = 0; i < sh->npg_end; i++) {
			    if (sh->pg_end[i] == p_id) {
				memmove(&sh->pg_end[i], &sh->pg_end[i+1],
					(sh->npg_end-i-1)*sizeof(*sh->pg_end));
				sh->npg_end--;
			    }
			}
		    }
		} else {
		    sh->pg[npg].prev_id = -1;
		}
	    }
	    tag = tag->next;
	}

	if (sh->pg[npg].name) {
	    khint_t k;
	    int r;
	    k = kh_put(m_s2i, sh->pg_hash, sh->pg[npg].name, &r);
	    if (-1 == r) return -1;
	    kh_val(sh->pg_hash, k) = npg;
	}

	/* Add to npg_end[] array. Remove later if we find a PP line */
	if (sh->npg_end >= sh->npg_end_alloc) {
	    sh->npg_end_alloc = sh->npg_end_alloc
		? sh->npg_end_alloc*2
		: 4;
	    sh->pg_end = realloc(sh->pg_end,
				 sh->npg_end_alloc * sizeof(int));
	    if (!sh->pg_end)
		return -1;
	}
	sh->pg_end[sh->npg_end++] = npg;

	sh->npg++;
    }

    return 0;
}